

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O0

void __thiscall
AlignmentRecord::mergeAlignmentRecordsSingle(AlignmentRecord *this,AlignmentRecord *ar,int i,int j)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint *puVar4;
  size_t sVar5;
  reference pcVar6;
  int in_ECX;
  int in_EDX;
  AlignmentRecord *in_RSI;
  long in_RDI;
  char i_3;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  char i_2;
  iterator __end3_1;
  iterator __begin3_1;
  string *__range3_1;
  char i_1;
  iterator __end3;
  iterator __begin3;
  string *__range3;
  int ref_rel_pos2;
  int ref_rel_pos1;
  int c_pos2;
  int c_pos1;
  int q_pos2;
  int q_pos1;
  vector<char,_std::allocator<char>_> cigar_3;
  vector<char,_std::allocator<char>_> cigar_2;
  vector<char,_std::allocator<char>_> cigar_1;
  vector<char,_std::allocator<char>_> cigar;
  int ref_e_pos2;
  int ref_s_pos2;
  int ref_e_pos1;
  int ref_s_pos1;
  int offset_b2;
  int offset_b1;
  int offset_f2;
  int offset_f1;
  string nucigar;
  string qualities;
  string algn;
  string ref;
  string dna;
  ShortDnaSequence *in_stack_fffffffffffffa18;
  ShortDnaSequence *in_stack_fffffffffffffa20;
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *in_stack_fffffffffffffa28;
  string *in_stack_fffffffffffffa30;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffa38;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffa40;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffa68;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffa70;
  string *in_stack_fffffffffffffa88;
  string *in_stack_fffffffffffffac8;
  string *in_stack_fffffffffffffad0;
  string *in_stack_fffffffffffffad8;
  AlignmentRecord *in_stack_fffffffffffffae0;
  string *in_stack_fffffffffffffae8;
  AlignmentRecord *in_stack_fffffffffffffaf0;
  string *in_stack_fffffffffffffb00;
  string *in_stack_fffffffffffffb08;
  ShortDnaSequence *in_stack_fffffffffffffb10;
  int *in_stack_fffffffffffffb18;
  undefined8 in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb3c;
  string *in_stack_fffffffffffffb40;
  AlignmentRecord *in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb54;
  string *in_stack_fffffffffffffb58;
  AlignmentRecord *in_stack_fffffffffffffb60;
  string *in_stack_fffffffffffffb70;
  int *in_stack_fffffffffffffb78;
  int *in_stack_fffffffffffffb80;
  int *in_stack_fffffffffffffb88;
  int *in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffb9c;
  int *in_stack_fffffffffffffba0;
  undefined8 in_stack_fffffffffffffba8;
  int in_stack_fffffffffffffbb0;
  uint local_344;
  uint local_340;
  uint local_33c;
  uint local_338;
  char local_331;
  undefined8 local_330;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_328;
  undefined1 *local_320;
  undefined8 local_2b8;
  undefined8 local_2b0;
  char local_2a1;
  undefined8 local_2a0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_298;
  undefined1 *local_290;
  uint local_228;
  uint local_224;
  undefined8 local_220;
  undefined8 local_218;
  char local_209;
  undefined8 local_208;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_200;
  undefined1 *local_1f8;
  uint local_190;
  uint local_18c;
  undefined1 local_188 [8];
  undefined1 local_180 [8];
  undefined1 local_178 [4];
  ShortDnaSequence local_174;
  int local_10c;
  undefined1 local_108 [12];
  int local_fc;
  int local_f8;
  int local_f4;
  int local_f0;
  allocator local_e9;
  undefined1 local_e8 [40];
  string local_c0 [39];
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  int local_18;
  int local_14;
  AlignmentRecord *local_10;
  
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"",&local_71);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"",&local_99);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"",(allocator *)(local_e8 + 0x27));
  std::allocator<char>::~allocator((allocator<char> *)(local_e8 + 0x27));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_e8,"",&local_e9);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  local_10c = 0;
  if (local_14 == 1) {
    local_f0 = computeOffset((vector<char,_std::allocator<char>_> *)
                             in_stack_fffffffffffffa40._M_current);
    local_f8 = computeRevOffset(in_stack_fffffffffffffa70);
    local_108._4_4_ = *(int *)(in_RDI + 0x28) + local_f8;
    local_108._8_4_ = *(int *)(in_RDI + 0x24) - local_f0;
    if (local_18 == 1) {
      getCigar1Unrolled(local_10);
      std::vector<char,_std::allocator<char>_>::vector
                (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
      local_f4 = computeOffset((vector<char,_std::allocator<char>_> *)
                               in_stack_fffffffffffffa40._M_current);
      local_fc = computeRevOffset(in_stack_fffffffffffffa70);
      uVar2 = getStart1(local_10);
      local_108._0_4_ = uVar2 - local_f4;
      uVar2 = getEnd1(local_10);
      local_10c = uVar2 + local_fc;
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffa30);
    }
    else {
      getCigar2Unrolled(local_10);
      std::vector<char,_std::allocator<char>_>::vector
                (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
      local_f4 = computeOffset((vector<char,_std::allocator<char>_> *)
                               in_stack_fffffffffffffa40._M_current);
      local_fc = computeRevOffset(in_stack_fffffffffffffa70);
      uVar2 = getStart2(local_10);
      local_108._0_4_ = uVar2 - local_f4;
      uVar2 = getEnd2(local_10);
      local_10c = uVar2 + local_fc;
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffa30);
    }
  }
  else {
    local_f0 = computeOffset((vector<char,_std::allocator<char>_> *)
                             in_stack_fffffffffffffa40._M_current);
    local_f8 = computeRevOffset(in_stack_fffffffffffffa70);
    local_108._8_4_ = *(int *)(in_RDI + 0xd4) - local_f0;
    local_108._4_4_ = *(int *)(in_RDI + 0xd8) + local_f8;
    if (local_18 == 1) {
      getCigar1Unrolled(local_10);
      std::vector<char,_std::allocator<char>_>::vector
                (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
      local_f4 = computeOffset((vector<char,_std::allocator<char>_> *)
                               in_stack_fffffffffffffa40._M_current);
      local_fc = computeRevOffset(in_stack_fffffffffffffa70);
      uVar2 = getStart1(local_10);
      local_108._0_4_ = uVar2 - local_f4;
      uVar2 = getEnd1(local_10);
      local_10c = uVar2 + local_fc;
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffa30);
    }
    else {
      getCigar2Unrolled(local_10);
      std::vector<char,_std::allocator<char>_>::vector
                (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
      local_f4 = computeOffset((vector<char,_std::allocator<char>_> *)
                               in_stack_fffffffffffffa40._M_current);
      local_fc = computeRevOffset(in_stack_fffffffffffffa70);
      uVar2 = getStart2(local_10);
      local_108._0_4_ = uVar2 - local_f4;
      uVar2 = getEnd2(local_10);
      local_10c = uVar2 + local_fc;
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffa30);
    }
  }
  local_174._vptr_ShortDnaSequence._0_4_ = 0;
  local_178 = (undefined1  [4])0x0;
  local_180._4_4_ = 0;
  local_180._0_4_ = 0;
  local_188._4_4_ = 0;
  local_188._0_4_ = 0;
  if (((int)local_108._0_4_ < (int)local_108._8_4_) || (local_10c < (int)local_108._4_4_)) {
    if (((int)local_108._0_4_ < (int)local_108._8_4_) || ((int)local_108._4_4_ < local_10c)) {
      if (((int)local_108._8_4_ < (int)local_108._0_4_) || (local_10c < (int)local_108._4_4_)) {
        while ((int)local_108._0_4_ < (int)local_108._8_4_) {
          in_stack_fffffffffffffa38._M_current =
               (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffa38._M_current >> 0x20),local_18)
          ;
          in_stack_fffffffffffffa30 = (string *)local_188;
          in_stack_fffffffffffffa28 =
               (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)local_108;
          in_stack_fffffffffffffa20 = (ShortDnaSequence *)local_178;
          in_stack_fffffffffffffa18 = (ShortDnaSequence *)local_180;
          noOverlapMerge(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                         &in_stack_fffffffffffffae0->name,in_stack_fffffffffffffad8,
                         in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                         (int *)in_stack_fffffffffffffb00,(int *)in_stack_fffffffffffffb08,
                         (int *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb18,
                         (int)in_stack_fffffffffffffb20);
        }
        while ((int)local_108._0_4_ <= local_10c) {
          in_stack_fffffffffffffa40._M_current = local_108;
          in_stack_fffffffffffffa38._M_current = local_178;
          in_stack_fffffffffffffa30 = (string *)(local_178 + 4);
          in_stack_fffffffffffffa28 =
               (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)local_180;
          in_stack_fffffffffffffa20 = (ShortDnaSequence *)(local_180 + 4);
          in_stack_fffffffffffffa18 = (ShortDnaSequence *)local_e8;
          overlapMerge(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
                       (string *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                       in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,
                       (string *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                       in_stack_fffffffffffffb70,in_stack_fffffffffffffb78,in_stack_fffffffffffffb80
                       ,in_stack_fffffffffffffb88,in_stack_fffffffffffffb90,
                       (int *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                       in_stack_fffffffffffffba0,(int)in_stack_fffffffffffffba8,
                       in_stack_fffffffffffffbb0);
        }
        while ((int)local_108._0_4_ <= (int)local_108._4_4_) {
          in_stack_fffffffffffffa38._M_current =
               (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffa38._M_current >> 0x20),local_14)
          ;
          in_stack_fffffffffffffa30 = (string *)(local_188 + 4);
          in_stack_fffffffffffffa28 =
               (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)local_108;
          in_stack_fffffffffffffa20 = (ShortDnaSequence *)(local_178 + 4);
          in_stack_fffffffffffffa18 = (ShortDnaSequence *)(local_180 + 4);
          noOverlapMerge(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                         &in_stack_fffffffffffffae0->name,in_stack_fffffffffffffad8,
                         in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                         (int *)in_stack_fffffffffffffb00,(int *)in_stack_fffffffffffffb08,
                         (int *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb18,
                         (int)in_stack_fffffffffffffb20);
        }
        updateReference(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
                        (int)((ulong)in_stack_fffffffffffffad0 >> 0x20),
                        (int)in_stack_fffffffffffffad0);
      }
      else {
        while ((int)local_108._0_4_ < (int)local_108._8_4_) {
          in_stack_fffffffffffffa38._M_current =
               (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffa38._M_current >> 0x20),local_18)
          ;
          in_stack_fffffffffffffa30 = (string *)local_188;
          in_stack_fffffffffffffa28 =
               (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)local_108;
          in_stack_fffffffffffffa20 = (ShortDnaSequence *)local_178;
          in_stack_fffffffffffffa18 = (ShortDnaSequence *)local_180;
          noOverlapMerge(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                         &in_stack_fffffffffffffae0->name,in_stack_fffffffffffffad8,
                         in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                         (int *)in_stack_fffffffffffffb00,(int *)in_stack_fffffffffffffb08,
                         (int *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb18,
                         (int)in_stack_fffffffffffffb20);
        }
        while ((int)local_108._0_4_ <= (int)local_108._4_4_) {
          in_stack_fffffffffffffa40._M_current = local_108;
          in_stack_fffffffffffffa38._M_current = local_178;
          in_stack_fffffffffffffa30 = (string *)(local_178 + 4);
          in_stack_fffffffffffffa28 =
               (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)local_180;
          in_stack_fffffffffffffa20 = (ShortDnaSequence *)(local_180 + 4);
          in_stack_fffffffffffffa18 = (ShortDnaSequence *)local_e8;
          overlapMerge(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
                       (string *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                       in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,
                       (string *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                       in_stack_fffffffffffffb70,in_stack_fffffffffffffb78,in_stack_fffffffffffffb80
                       ,in_stack_fffffffffffffb88,in_stack_fffffffffffffb90,
                       (int *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                       in_stack_fffffffffffffba0,(int)in_stack_fffffffffffffba8,
                       in_stack_fffffffffffffbb0);
        }
        local_188._0_4_ = local_188._4_4_ + -1 + local_188._0_4_;
        while ((int)local_108._0_4_ <= local_10c) {
          in_stack_fffffffffffffa38._M_current =
               (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffa38._M_current >> 0x20),local_18)
          ;
          in_stack_fffffffffffffa30 = (string *)local_188;
          in_stack_fffffffffffffa28 =
               (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)local_108;
          in_stack_fffffffffffffa20 = (ShortDnaSequence *)local_178;
          in_stack_fffffffffffffa18 = (ShortDnaSequence *)local_180;
          noOverlapMerge(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                         &in_stack_fffffffffffffae0->name,in_stack_fffffffffffffad8,
                         in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                         (int *)in_stack_fffffffffffffb00,(int *)in_stack_fffffffffffffb08,
                         (int *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb18,
                         (int)in_stack_fffffffffffffb20);
        }
        updateReference(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
                        (int)((ulong)in_stack_fffffffffffffad0 >> 0x20),
                        (int)in_stack_fffffffffffffad0);
      }
    }
    else {
      while ((int)local_108._8_4_ < (int)local_108._0_4_) {
        in_stack_fffffffffffffa38._M_current =
             (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffa38._M_current >> 0x20),local_14);
        in_stack_fffffffffffffa30 = (string *)(local_188 + 4);
        in_stack_fffffffffffffa28 =
             (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)(local_108 + 8);
        in_stack_fffffffffffffa20 = (ShortDnaSequence *)(local_178 + 4);
        in_stack_fffffffffffffa18 = (ShortDnaSequence *)(local_180 + 4);
        noOverlapMerge(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                       &in_stack_fffffffffffffae0->name,in_stack_fffffffffffffad8,
                       in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                       (int *)in_stack_fffffffffffffb00,(int *)in_stack_fffffffffffffb08,
                       (int *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb18,
                       (int)in_stack_fffffffffffffb20);
      }
      while ((int)local_108._8_4_ <= local_10c) {
        in_stack_fffffffffffffa40._M_current = local_108 + 8;
        in_stack_fffffffffffffa38._M_current = local_178;
        in_stack_fffffffffffffa30 = (string *)(local_178 + 4);
        in_stack_fffffffffffffa28 =
             (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)local_180;
        in_stack_fffffffffffffa20 = (ShortDnaSequence *)(local_180 + 4);
        in_stack_fffffffffffffa18 = (ShortDnaSequence *)local_e8;
        overlapMerge(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
                     (string *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                     in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,
                     (string *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                     in_stack_fffffffffffffb70,in_stack_fffffffffffffb78,in_stack_fffffffffffffb80,
                     in_stack_fffffffffffffb88,in_stack_fffffffffffffb90,
                     (int *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                     in_stack_fffffffffffffba0,(int)in_stack_fffffffffffffba8,
                     in_stack_fffffffffffffbb0);
      }
      while ((int)local_108._8_4_ <= (int)local_108._4_4_) {
        in_stack_fffffffffffffa38._M_current =
             (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffa38._M_current >> 0x20),local_14);
        in_stack_fffffffffffffa30 = (string *)(local_188 + 4);
        in_stack_fffffffffffffa28 =
             (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)(local_108 + 8);
        in_stack_fffffffffffffa20 = (ShortDnaSequence *)(local_178 + 4);
        in_stack_fffffffffffffa18 = (ShortDnaSequence *)(local_180 + 4);
        noOverlapMerge(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                       &in_stack_fffffffffffffae0->name,in_stack_fffffffffffffad8,
                       in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                       (int *)in_stack_fffffffffffffb00,(int *)in_stack_fffffffffffffb08,
                       (int *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb18,
                       (int)in_stack_fffffffffffffb20);
      }
      updateReference(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
                      (int)((ulong)in_stack_fffffffffffffad0 >> 0x20),(int)in_stack_fffffffffffffad0
                     );
    }
  }
  else {
    while ((int)local_108._8_4_ < (int)local_108._0_4_) {
      in_stack_fffffffffffffa38._M_current =
           (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffa38._M_current >> 0x20),local_14);
      in_stack_fffffffffffffa30 = (string *)(local_188 + 4);
      in_stack_fffffffffffffa28 =
           (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)(local_108 + 8);
      in_stack_fffffffffffffa20 = (ShortDnaSequence *)(local_178 + 4);
      in_stack_fffffffffffffa18 = (ShortDnaSequence *)(local_180 + 4);
      noOverlapMerge(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                     &in_stack_fffffffffffffae0->name,in_stack_fffffffffffffad8,
                     in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                     (int *)in_stack_fffffffffffffb00,(int *)in_stack_fffffffffffffb08,
                     (int *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb18,
                     (int)in_stack_fffffffffffffb20);
    }
    local_188._0_4_ = local_188._4_4_;
    while ((int)local_108._8_4_ <= (int)local_108._4_4_) {
      in_stack_fffffffffffffa40._M_current = local_108 + 8;
      in_stack_fffffffffffffa38._M_current = local_178;
      in_stack_fffffffffffffa30 = (string *)(local_178 + 4);
      in_stack_fffffffffffffa28 =
           (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)local_180;
      in_stack_fffffffffffffa20 = (ShortDnaSequence *)(local_180 + 4);
      in_stack_fffffffffffffa18 = (ShortDnaSequence *)local_e8;
      overlapMerge(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
                   (string *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                   in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,
                   (string *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                   in_stack_fffffffffffffb70,in_stack_fffffffffffffb78,in_stack_fffffffffffffb80,
                   in_stack_fffffffffffffb88,in_stack_fffffffffffffb90,
                   (int *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                   in_stack_fffffffffffffba0,(int)in_stack_fffffffffffffba8,
                   in_stack_fffffffffffffbb0);
    }
    local_188._0_4_ = local_188._4_4_ - local_188._0_4_;
    while ((int)local_108._8_4_ <= local_10c) {
      in_stack_fffffffffffffa38._M_current =
           (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffa38._M_current >> 0x20),local_18);
      in_stack_fffffffffffffa30 = (string *)local_188;
      in_stack_fffffffffffffa28 =
           (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)(local_108 + 8);
      in_stack_fffffffffffffa20 = (ShortDnaSequence *)local_178;
      in_stack_fffffffffffffa18 = (ShortDnaSequence *)local_180;
      noOverlapMerge(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                     &in_stack_fffffffffffffae0->name,in_stack_fffffffffffffad8,
                     in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                     (int *)in_stack_fffffffffffffb00,(int *)in_stack_fffffffffffffb08,
                     (int *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb18,
                     (int)in_stack_fffffffffffffb20);
    }
    updateReference(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
                    (int)((ulong)in_stack_fffffffffffffad0 >> 0x20),(int)in_stack_fffffffffffffad0);
  }
  if (local_14 == 1) {
    if (local_18 == 1) {
      puVar4 = (uint *)(in_RDI + 0x24);
      local_18c = getStart1(local_10);
      puVar4 = std::min<unsigned_int>(puVar4,&local_18c);
      *(uint *)(in_RDI + 0x24) = *puVar4;
      local_190 = getEnd1(local_10);
      puVar4 = std::max<unsigned_int>(&local_190,(uint *)(in_RDI + 0x28));
      *(uint *)(in_RDI + 0x28) = *puVar4;
      *(undefined1 *)(in_RDI + 0x184) = 1;
      createCigar(in_stack_fffffffffffffa88);
      std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::operator=
                ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
                 in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
      std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::~vector
                ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
                 in_stack_fffffffffffffa30);
      ShortDnaSequence::ShortDnaSequence
                (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
      ShortDnaSequence::operator=(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
      ShortDnaSequence::~ShortDnaSequence(in_stack_fffffffffffffa20);
      iVar3 = phred_sum(in_stack_fffffffffffffa30,(char)((ulong)in_stack_fffffffffffffa28 >> 0x38));
      *(int *)(in_RDI + 0x20) = iVar3;
      sVar5 = ShortDnaSequence::size((ShortDnaSequence *)0x2846a8);
      *(int *)(in_RDI + 0x60) = (int)sVar5;
      sVar5 = ShortDnaSequence::size((ShortDnaSequence *)0x2846ce);
      *(int *)(in_RDI + 100) = (int)sVar5;
      std::vector<char,_std::allocator<char>_>::clear
                ((vector<char,_std::allocator<char>_> *)0x2846f4);
      local_1f8 = local_e8;
      local_200._M_current = (char *)std::__cxx11::string::begin();
      local_208 = std::__cxx11::string::end();
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)in_stack_fffffffffffffa20,
                                (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)in_stack_fffffffffffffa18), bVar1) {
        pcVar6 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_200);
        local_209 = *pcVar6;
        std::vector<char,_std::allocator<char>_>::push_back
                  ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffa30,
                   (value_type *)in_stack_fffffffffffffa28);
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_200);
      }
      std::__cxx11::string::operator=((string *)(in_RDI + 0x1e0),local_70);
      std::__cxx11::string::operator=((string *)(in_RDI + 0x220),local_98);
      local_218 = std::__cxx11::string::begin();
      local_220 = std::__cxx11::string::end();
      std::vector<int,std::allocator<int>>::
      assign<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa30,
                 in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
    }
    else {
      puVar4 = (uint *)(in_RDI + 0x24);
      local_224 = getStart2(local_10);
      puVar4 = std::min<unsigned_int>(puVar4,&local_224);
      *(uint *)(in_RDI + 0xd4) = *puVar4;
      local_228 = getEnd2(local_10);
      puVar4 = std::max<unsigned_int>((uint *)(in_RDI + 0x28),&local_228);
      *(uint *)(in_RDI + 0xd8) = *puVar4;
      createCigar(in_stack_fffffffffffffa88);
      std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::operator=
                ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
                 in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
      std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::~vector
                ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
                 in_stack_fffffffffffffa30);
      ShortDnaSequence::ShortDnaSequence
                (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
      ShortDnaSequence::operator=(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
      ShortDnaSequence::~ShortDnaSequence(in_stack_fffffffffffffa20);
      iVar3 = phred_sum(in_stack_fffffffffffffa30,(char)((ulong)in_stack_fffffffffffffa28 >> 0x38));
      *(int *)(in_RDI + 0xd0) = iVar3;
      sVar5 = ShortDnaSequence::size((ShortDnaSequence *)0x2849d8);
      *(int *)(in_RDI + 0x110) = (int)sVar5;
      sVar5 = ShortDnaSequence::size((ShortDnaSequence *)0x284a04);
      *(int *)(in_RDI + 0x114) = (int)sVar5;
      std::vector<char,_std::allocator<char>_>::clear
                ((vector<char,_std::allocator<char>_> *)0x284a30);
      local_290 = local_e8;
      local_298._M_current = (char *)std::__cxx11::string::begin();
      local_2a0 = std::__cxx11::string::end();
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)in_stack_fffffffffffffa20,
                                (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)in_stack_fffffffffffffa18), bVar1) {
        pcVar6 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_298);
        local_2a1 = *pcVar6;
        std::vector<char,_std::allocator<char>_>::push_back
                  ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffa30,
                   (value_type *)in_stack_fffffffffffffa28);
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_298);
      }
      std::__cxx11::string::operator=((string *)(in_RDI + 0x200),local_70);
      std::__cxx11::string::operator=((string *)(in_RDI + 0x240),local_98);
      local_2b0 = std::__cxx11::string::begin();
      local_2b8 = std::__cxx11::string::end();
      std::vector<int,std::allocator<int>>::
      assign<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa30,
                 in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
    }
  }
  else {
    *(undefined1 *)(in_RDI + 0x184) = 0;
    createCigar(in_stack_fffffffffffffa88);
    std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::operator=
              ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
               in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
    std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::~vector
              ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
               in_stack_fffffffffffffa30);
    ShortDnaSequence::ShortDnaSequence
              (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
    ShortDnaSequence::operator=(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    ShortDnaSequence::~ShortDnaSequence(in_stack_fffffffffffffa20);
    iVar3 = phred_sum(in_stack_fffffffffffffa30,(char)((ulong)in_stack_fffffffffffffa28 >> 0x38));
    *(int *)(in_RDI + 0xd0) = iVar3;
    sVar5 = ShortDnaSequence::size((ShortDnaSequence *)0x284c52);
    *(int *)(in_RDI + 0x110) = (int)sVar5;
    sVar5 = ShortDnaSequence::size((ShortDnaSequence *)0x284c7e);
    *(int *)(in_RDI + 0x114) = (int)sVar5;
    std::vector<char,_std::allocator<char>_>::clear((vector<char,_std::allocator<char>_> *)0x284caa)
    ;
    local_320 = local_e8;
    local_328._M_current = (char *)std::__cxx11::string::begin();
    local_330 = std::__cxx11::string::end();
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)in_stack_fffffffffffffa20,
                              (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)in_stack_fffffffffffffa18), bVar1) {
      pcVar6 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_328);
      local_331 = *pcVar6;
      std::vector<char,_std::allocator<char>_>::push_back
                ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffa30,
                 (value_type *)in_stack_fffffffffffffa28);
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_328);
    }
    if (local_18 == 1) {
      local_338 = getStart1(local_10);
      puVar4 = std::min<unsigned_int>((uint *)(in_RDI + 0xd4),&local_338);
      *(uint *)(in_RDI + 0xd4) = *puVar4;
      local_33c = getEnd1(local_10);
      puVar4 = std::max<unsigned_int>(&local_33c,(uint *)(in_RDI + 0xd8));
      *(uint *)(in_RDI + 0xd8) = *puVar4;
    }
    else {
      local_340 = getStart2(local_10);
      puVar4 = std::min<unsigned_int>((uint *)(in_RDI + 0xd4),&local_340);
      *(uint *)(in_RDI + 0xd4) = *puVar4;
      local_344 = getEnd2(local_10);
      puVar4 = std::max<unsigned_int>(&local_344,(uint *)(in_RDI + 0xd8));
      *(uint *)(in_RDI + 0xd8) = *puVar4;
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 0x200),local_70);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x240),local_98);
    std::__cxx11::string::begin();
    std::__cxx11::string::end();
    std::vector<int,std::allocator<int>>::
    assign<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa30,
               in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  }
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void AlignmentRecord::mergeAlignmentRecordsSingle(const AlignmentRecord& ar, int i, int j){
    std::string dna = "";
    std::string ref = "";
    std::string algn = "";
    std::string qualities = "";
    std::string nucigar = "";
    int offset_f1, offset_f2, offset_b1, offset_b2, ref_s_pos1, ref_e_pos1, ref_s_pos2,ref_e_pos2 = 0;
    //i and j determine which cigar strings / sequences are considered

    if (i == 1){
         //get starting position and ending position according to ref position, paying attention to clipped bases
         //updated ref position including clips
         offset_f1 = computeOffset(this->cigar1_unrolled);
         offset_b1 = computeRevOffset(this->cigar1_unrolled);
         ref_e_pos1 = this->end1+offset_b1;
         ref_s_pos1 = this->start1-offset_f1;
         if(j == 1){
             std::vector<char> cigar = ar.getCigar1Unrolled();
             offset_f2 = computeOffset(cigar);
             offset_b2 = computeRevOffset(cigar);
             ref_s_pos2 = ar.getStart1()-offset_f2;
             ref_e_pos2 = ar.getEnd1()+offset_b2;
         } else {
             std::vector<char> cigar = ar.getCigar2Unrolled();
             offset_f2 = computeOffset(cigar);
             offset_b2 = computeRevOffset(cigar);
             ref_s_pos2 = ar.getStart2()-offset_f2;
             ref_e_pos2 = ar.getEnd2()+offset_b2;
         }
    } else {
         //get starting position and ending position according to ref position, paying attention to clipped bases
         //updated ref position including clips
         offset_f1 = computeOffset(this->cigar2_unrolled);
         offset_b1 = computeRevOffset(this->cigar2_unrolled);
         ref_s_pos1 = this->start2-offset_f1;
         ref_e_pos1 = this->end2+offset_b1;
         if(j == 1){
             std::vector<char> cigar = ar.getCigar1Unrolled();
             offset_f2 = computeOffset(cigar);
             offset_b2 = computeRevOffset(cigar);
             ref_s_pos2 = ar.getStart1()-offset_f2;
             ref_e_pos2 = ar.getEnd1()+offset_b2;
         } else {
             std::vector<char> cigar = ar.getCigar2Unrolled();
             offset_f2 = computeOffset(cigar);
             offset_b2 = computeRevOffset(cigar);
             ref_s_pos2 = ar.getStart2()-offset_f2;
             ref_e_pos2 = ar.getEnd2()+offset_b2;
         }
    }

    //position in query sequences // phred scores
    int q_pos1 = 0;
    int q_pos2 = 0;
    //position in unrolled cigar vectors
    int c_pos1 = 0;
    int c_pos2 = 0;
    //Position in the reference strings
    int ref_rel_pos1 =0;
    int ref_rel_pos2 =0;
    //4 cases of different overlaps
    //------------
    //     ------------
    if(ref_s_pos1 <= ref_s_pos2 && ref_e_pos1 <= ref_e_pos2){
        while(ref_s_pos1<ref_s_pos2){
            noOverlapMerge(algn,ref,dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos1,ref_rel_pos1,i);
        }
        ref_rel_pos2 = ref_rel_pos1;
        while(ref_s_pos1<=ref_e_pos1){
            overlapMerge(algn,ref,ar,dna,qualities,nucigar,c_pos1,c_pos2,q_pos1,q_pos2,ref_s_pos1,ref_rel_pos1,i,j);
        }
        ref_rel_pos2 = ref_rel_pos1-ref_rel_pos2;
        while(ref_s_pos1<=ref_e_pos2){
            ar.noOverlapMerge(algn,ref,dna, qualities, nucigar, c_pos2, q_pos2, ref_s_pos1,ref_rel_pos2,j);
        }
        ar.updateReference(ref,j,ref_rel_pos2);

    }//------------------------------
        //           ----------
     else if (ref_s_pos1 <= ref_s_pos2 && ref_e_pos1 >= ref_e_pos2){
        while(ref_s_pos1<ref_s_pos2){
            noOverlapMerge(algn,ref,dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos1,ref_rel_pos1,i);
        }
        while(ref_s_pos1<=ref_e_pos2){
            overlapMerge(algn,ref,ar,dna,qualities,nucigar,c_pos1,c_pos2,q_pos1,q_pos2,ref_s_pos1,ref_rel_pos1,i,j);
        }
        while(ref_s_pos1<=ref_e_pos1){
            noOverlapMerge(algn,ref,dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos1,ref_rel_pos1,i);
        }
        updateReference(ref,i,ref_rel_pos1);
        //           ----------
        //--------------------------
    } else if (ref_s_pos1 >= ref_s_pos2 && ref_e_pos1 <= ref_e_pos2){
        while(ref_s_pos2<ref_s_pos1){
            ar.noOverlapMerge(algn,ref,dna, qualities, nucigar, c_pos2, q_pos2, ref_s_pos2,ref_rel_pos2,j);
        }
        while(ref_s_pos2<=ref_e_pos1){
            overlapMerge(algn,ref,ar,dna,qualities,nucigar,c_pos1,c_pos2,q_pos1,q_pos2,ref_s_pos2,ref_rel_pos1,i,j);
        }
        ref_rel_pos2 += ref_rel_pos1-1;
        while(ref_s_pos2<=ref_e_pos2){//Why is it less that equals here?Check with paper
            ar.noOverlapMerge(algn,ref,dna, qualities, nucigar, c_pos2, q_pos2, ref_s_pos2,ref_rel_pos2,j);
        }
        ar.updateReference(ref,j,ref_rel_pos2);
        //           --------------------
        //---------------------
    } else {
        assert(ref_s_pos1 >= ref_s_pos2 && ref_e_pos1 >= ref_e_pos2);
        while(ref_s_pos2<ref_s_pos1){
            ar.noOverlapMerge(algn,ref,dna, qualities, nucigar, c_pos2, q_pos2, ref_s_pos2,ref_rel_pos2,j);
        }
        while(ref_s_pos2<=ref_e_pos2){
            overlapMerge(algn,ref,ar,dna,qualities,nucigar, c_pos1,c_pos2,q_pos1,q_pos2,ref_s_pos2,ref_rel_pos1,i,j);
        }
        while(ref_s_pos2<=ref_e_pos1){
            noOverlapMerge(algn,ref,dna,qualities,nucigar, c_pos1,q_pos1,ref_s_pos2,ref_rel_pos1,i);
        }
        updateReference(ref,i,ref_rel_pos1);

    }
    if (i == 1){
        if(j == 1){
            this->start1 = std::min(this->start1,ar.getStart1());
            this->end1=std::max(ar.getEnd1(),this->end1);
            this->single_end= true;
            this->cigar1 = createCigar(nucigar);
            this->sequence1=ShortDnaSequence(dna,qualities);
            this->phred_sum1=phred_sum(qualities);
            this->length_incl_deletions1 = this->sequence1.size();
            this->length_incl_longdeletions1 = this->sequence1.size();
            this->cigar1_unrolled.clear();
            for (char i : nucigar){
                this->cigar1_unrolled.push_back(i);
            }
            this->reference_seq1 = ref;
            this->alignSequence1 = algn;
            this->qualityList1.assign(qualities.begin(),qualities.end());

        } else {
            this->start2 = std::min(this->start1,ar.getStart2());
            this->end2 = std::max(this->end1,ar.getEnd2());
            this->cigar2 = createCigar(nucigar);
            this->sequence2=ShortDnaSequence(dna,qualities);
            this->phred_sum2=phred_sum(qualities);
            this->length_incl_deletions2 = this->sequence2.size();
            this->length_incl_longdeletions2 = this->sequence2.size();
            this->cigar2_unrolled.clear();
            for (char i : nucigar){
                this->cigar2_unrolled.push_back(i);
            }
            this->reference_seq2 = ref;
            this->alignSequence2 = algn;
            this->qualityList2.assign(qualities.begin(),qualities.end());
        }
    } else {
        this->single_end= false;
        this->cigar2 = createCigar(nucigar);
        this->sequence2=ShortDnaSequence(dna,qualities);
        this->phred_sum2=phred_sum(qualities);
        this->length_incl_deletions2 = this->sequence2.size();
        this->length_incl_longdeletions2 = this->sequence2.size();
        this->cigar2_unrolled.clear();
        for (char i : nucigar){
            this->cigar2_unrolled.push_back(i);
        }
        if(j == 1){
            this->start2 = std::min(this->start2,ar.getStart1());
            this->end2=std::max(ar.getEnd1(),this->end2);

        }else {
            this->start2 = std::min(this->start2,ar.getStart2());
            this->end2=std::max(ar.getEnd2(),this->end2);
        }
        this->reference_seq2 = ref;
        this->alignSequence2 = algn;
        this->qualityList2.assign(qualities.begin(),qualities.end());
    }
}